

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.hpp
# Opt level: O0

uchar __thiscall
ImageT<unsigned_char,_2U>::swizzlePixel
          (ImageT<unsigned_char,_2U> *this,Color *srcPixel,char swizzle)

{
  uchar *puVar1;
  char in_DL;
  color<unsigned_char,_2U> *in_RSI;
  uchar local_1;
  
  if (in_DL == '0') {
    local_1 = '\0';
  }
  else if (in_DL == '1') {
    local_1 = color_base<unsigned_char,_2U>::one();
  }
  else if (in_DL == 'a') {
    puVar1 = color<unsigned_char,_2U>::operator[](in_RSI,3);
    local_1 = *puVar1;
  }
  else if (in_DL == 'b') {
    puVar1 = color<unsigned_char,_2U>::operator[](in_RSI,2);
    local_1 = *puVar1;
  }
  else if (in_DL == 'g') {
    puVar1 = color<unsigned_char,_2U>::operator[](in_RSI,1);
    local_1 = *puVar1;
  }
  else {
    if (in_DL != 'r') {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/imageio/./image.hpp"
                    ,0x535,
                    "componentType ImageT<unsigned char, 2>::swizzlePixel(const Color &, char) [componentType = unsigned char, componentCount = 2]"
                   );
    }
    puVar1 = color<unsigned_char,_2U>::operator[](in_RSI,0);
    local_1 = *puVar1;
  }
  return local_1;
}

Assistant:

componentType swizzlePixel(const Color& srcPixel, char swizzle) {
        switch (swizzle) {
          case 'r':
            return srcPixel[0];
          case 'g':
            return srcPixel[1];
          case 'b':
            return srcPixel[2];
          case 'a':
            return srcPixel[3];
          case '0':
            return componentType{0};
          case '1':
            return Color::one();
          default:
            assert(false);
            return componentType{0};
        }
    }